

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemory.c
# Opt level: O2

void deMemory_selfTest(void)

{
  ulong numBytes;
  void *pvVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  
  for (lVar2 = 8; lVar2 != 0xb8; lVar2 = lVar2 + 0x10) {
    sVar3 = *(size_t *)((long)&deMemory_selfTest::s_alignedAllocCases[0].numBytes + lVar2);
    pvVar1 = deAlignedMalloc(*(size_t *)(&UNK_0060f448 + lVar2),sVar3);
    if (pvVar1 == (void *)0x0) {
      deAssertFail("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x141);
    }
    if ((sVar3 - 1 & (ulong)pvVar1) != 0) {
      deAssertFail("deIsAlignedPtr(ptr, s_alignedAllocCases[caseNdx].alignment)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x142);
    }
    free(pvVar1);
  }
  for (lVar2 = 0; lVar2 != 0xf; lVar2 = lVar2 + 1) {
    sVar3 = deMemory_selfTest::s_alignedReallocCases[lVar2].initialSize;
    sVar5 = deMemory_selfTest::s_alignedReallocCases[lVar2].alignment;
    pvVar1 = deAlignedMalloc(sVar3,sVar5);
    if (pvVar1 == (void *)0x0) {
      deAssertFail("ptr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x14d);
    }
    uVar4 = sVar5 - 1 & (ulong)pvVar1;
    if (uVar4 != 0) {
      deAssertFail("deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x14e);
    }
    memset(pvVar1,0xaa,sVar3);
    numBytes = deMemory_selfTest::s_alignedReallocCases[lVar2].newSize;
    pvVar1 = deAlignedRealloc(pvVar1,numBytes,sVar5);
    if (numBytes < sVar3) {
      sVar3 = numBytes;
    }
    if (pvVar1 == (void *)0x0) {
      deAssertFail("newPtr",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x159);
    }
    if (uVar4 != 0) {
      deAssertFail("deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                   ,0x15a);
    }
    for (sVar5 = 0; sVar3 != sVar5; sVar5 = sVar5 + 1) {
      if (*(char *)((long)pvVar1 + sVar5) != -0x56) {
        deAssertFail("*((const deUint8*)newPtr + off) == 0xaa",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/debase/deMemory.c"
                     ,0x15d);
      }
    }
    free(pvVar1);
  }
  return;
}

Assistant:

void deMemory_selfTest (void)
{
	static const struct
	{
		size_t		numBytes;
		size_t		alignment;
	} s_alignedAllocCases[] =
	{
		{ 1,		1		},
		{ 1,		2		},
		{ 1,		256		},
		{ 1,		4096	},
		{ 547389,	1		},
		{ 547389,	2		},
		{ 547389,	256		},
		{ 547389,	4096	},
		{ 52532,	1<<4	},
		{ 52532,	1<<10	},
		{ 52532,	1<<16	},
	};
	static const struct
	{
		size_t		initialSize;
		size_t		newSize;
		size_t		alignment;
	} s_alignedReallocCases[] =
	{
		{ 1,		1,		1		},
		{ 1,		1,		2		},
		{ 1,		1,		256		},
		{ 1,		1,		4096	},
		{ 1,		1241,	1		},
		{ 1,		1241,	2		},
		{ 1,		1241,	256		},
		{ 1,		1241,	4096	},
		{ 547389,	234,	1		},
		{ 547389,	234,	2		},
		{ 547389,	234,	256		},
		{ 547389,	234,	4096	},
		{ 52532,	421523,	1<<4	},
		{ 52532,	421523,	1<<10	},
		{ 52532,	421523,	1<<16	},
	};

	int caseNdx;

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_alignedAllocCases); caseNdx++)
	{
		void* const		ptr		= deAlignedMalloc(s_alignedAllocCases[caseNdx].numBytes, s_alignedAllocCases[caseNdx].alignment);

		DE_TEST_ASSERT(ptr);
		DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedAllocCases[caseNdx].alignment));

		deMemset(ptr, 0xaa, s_alignedAllocCases[caseNdx].numBytes);

		deAlignedFree(ptr);
	}

	for (caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(s_alignedReallocCases); caseNdx++)
	{
		void* const		ptr		= deAlignedMalloc(s_alignedReallocCases[caseNdx].initialSize, s_alignedReallocCases[caseNdx].alignment);

		DE_TEST_ASSERT(ptr);
		DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment));

		deMemset(ptr, 0xaa, s_alignedReallocCases[caseNdx].initialSize);

		{
			void* const		newPtr			= deAlignedRealloc(ptr, s_alignedReallocCases[caseNdx].newSize, s_alignedReallocCases[caseNdx].alignment);
			const size_t	numPreserved	= s_alignedReallocCases[caseNdx].newSize < s_alignedReallocCases[caseNdx].initialSize
											? s_alignedReallocCases[caseNdx].newSize
											: s_alignedReallocCases[caseNdx].initialSize;
			size_t			off;

			DE_TEST_ASSERT(newPtr);
			DE_TEST_ASSERT(deIsAlignedPtr(ptr, s_alignedReallocCases[caseNdx].alignment));

			for (off = 0; off < numPreserved; off++)
				DE_TEST_ASSERT(*((const deUint8*)newPtr + off) == 0xaa);

			deAlignedFree(newPtr);
		}
	}
}